

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3376::ProfileDataTest::ProfileDataTest(ProfileDataTest *this)

{
  char *pcVar1;
  char *__path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_29;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ProfileDataTest_00147970;
  ProfileData::ProfileData(&this->collector_);
  (this->checker_).filename_._M_dataplus._M_p = (pointer)&(this->checker_).filename_.field_2;
  (this->checker_).filename_._M_string_length = 0;
  (this->checker_).filename_.field_2._M_local_buf[0] = '\0';
  pcVar1 = getenv("TMPDIR");
  __path = "/tmp";
  if (pcVar1 != (char *)0x0) {
    __path = pcVar1;
  }
  mkdir(__path,0x1ed);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__path,&local_29);
  std::operator+(&local_70,&local_50,"/profiledata_unittest.tmp");
  std::__cxx11::string::operator=((string *)&this->checker_,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void ExpectStopped() {
    EXPECT_FALSE(collector_.enabled());
  }